

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

bool ImGui::TableNextColumn(void)

{
  ImGuiTable *table;
  int column_n;
  bool bVar1;
  
  table = GImGui->CurrentTable;
  if (table == (ImGuiTable *)0x0) {
    bVar1 = false;
  }
  else {
    if ((table->IsInsideRow == true) && (table->CurrentColumn + 1 < table->ColumnsCount)) {
      if (table->CurrentColumn == -1) {
        column_n = 0;
      }
      else {
        TableEndCell(table);
        column_n = table->CurrentColumn + 1;
      }
    }
    else {
      column_n = 0;
      TableNextRow(0,0.0);
    }
    TableBeginCell(table,column_n);
    bVar1 = (table->RequestOutputMaskByIndex >> ((ulong)(uint)table->CurrentColumn & 0x3f) & 1) != 0
    ;
  }
  return bVar1;
}

Assistant:

bool ImGui::TableNextColumn()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (!table)
        return false;

    if (table->IsInsideRow && table->CurrentColumn + 1 < table->ColumnsCount)
    {
        if (table->CurrentColumn != -1)
            TableEndCell(table);
        TableBeginCell(table, table->CurrentColumn + 1);
    }
    else
    {
        TableNextRow();
        TableBeginCell(table, 0);
    }

    // Return whether the column is visible. User may choose to skip submitting items based on this return value,
    // however they shouldn't skip submitting for columns that may have the tallest contribution to row height.
    int column_n = table->CurrentColumn;
    return (table->RequestOutputMaskByIndex & ((ImU64)1 << column_n)) != 0;
}